

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool_args.cpp
# Opt level: O2

Result<void> *
ApplyArgsManOptions(Result<void> *__return_storage_ptr__,ArgsManager *argsman,
                   CChainParams *chainparams,MemPoolOptions *mempool_opts)

{
  long lVar1;
  string_view source_file;
  string_view source_file_00;
  string original;
  bool bVar2;
  int64_t iVar3;
  Logger *pLVar4;
  MemPoolOptions *strDefault;
  bilingual_str *this;
  string *this_00;
  long in_FS_OFFSET;
  string_view str;
  string_view str_00;
  string_view logging_function;
  string_view logging_function_00;
  optional<long> oVar5;
  undefined8 in_stack_fffffffffffffd98;
  char *in_stack_fffffffffffffda0;
  undefined8 in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb4;
  FeeEstimateMode local_240 [2];
  string local_238;
  string log_msg;
  bilingual_str local_1d8;
  bilingual_str local_198;
  string local_158;
  bilingual_str local_138;
  bilingual_str local_f8;
  allocator<char> local_b8 [32];
  string local_98;
  string local_78;
  string local_58;
  _Alloc_hider local_38;
  
  local_38._M_p = *(pointer *)(in_FS_OFFSET + 0x28);
  strDefault = mempool_opts;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&log_msg,"-checkmempool",(allocator<char> *)&local_58);
  iVar3 = ArgsManager::GetIntArg(argsman,&log_msg,(long)mempool_opts->check_ratio);
  mempool_opts->check_ratio = (int)iVar3;
  std::__cxx11::string::~string((string *)&log_msg);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&log_msg,"-maxmempool",(allocator<char> *)&local_58);
  oVar5 = ArgsManager::GetIntArg(argsman,&log_msg);
  std::__cxx11::string::~string((string *)&log_msg);
  if (((undefined1  [16])
       oVar5.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long> &
      (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    mempool_opts->max_size_bytes =
         oVar5.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
         _M_payload * 1000000;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&log_msg,"-mempoolexpiry",(allocator<char> *)&local_58);
  oVar5 = ArgsManager::GetIntArg(argsman,&log_msg);
  std::__cxx11::string::~string((string *)&log_msg);
  if (((undefined1  [16])
       oVar5.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long> &
      (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    (mempool_opts->expiry).__r =
         oVar5.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
         _M_payload * 0xe10;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&log_msg,"-incrementalrelayfee",(allocator<char> *)&local_58);
  bVar2 = ArgsManager::IsArgSet(argsman,&log_msg);
  std::__cxx11::string::~string((string *)&log_msg);
  if (bVar2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"-incrementalrelayfee",(allocator<char> *)&local_98);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"",local_b8);
    strDefault = (MemPoolOptions *)&local_78;
    ArgsManager::GetArg(&log_msg,argsman,&local_58,(string *)strDefault);
    oVar5 = ParseMoney(&log_msg);
    std::__cxx11::string::~string((string *)&log_msg);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_58);
    if (((undefined1  [16])
         oVar5.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>
        & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      (mempool_opts->incremental_relay_feerate).nSatoshisPerK =
           oVar5.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>._M_payload;
      goto LAB_007a97e9;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&log_msg,"incrementalrelayfee",local_b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"-incrementalrelayfee",(allocator<char> *)&local_158);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"",(allocator<char> *)local_240);
    ArgsManager::GetArg(&local_58,argsman,&local_78,&local_98);
    common::AmountErrMsg(&local_f8,&log_msg,&local_58);
    std::__detail::__variant::_Variant_storage<false,bilingual_str,std::monostate>::
    _Variant_storage<0ul,bilingual_str>
              ((_Variant_storage<false,bilingual_str,std::monostate> *)__return_storage_ptr__,
               &local_f8);
    this = &local_f8;
LAB_007a9fcb:
    bilingual_str::~bilingual_str(this);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_78);
    this_00 = &log_msg;
  }
  else {
LAB_007a97e9:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&log_msg,"-minrelaytxfee",(allocator<char> *)&local_58);
    bVar2 = ArgsManager::IsArgSet(argsman,&log_msg);
    std::__cxx11::string::~string((string *)&log_msg);
    if (bVar2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_58,"-minrelaytxfee",(allocator<char> *)&local_98);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"",local_b8);
      strDefault = (MemPoolOptions *)&local_78;
      ArgsManager::GetArg(&log_msg,argsman,&local_58,(string *)strDefault);
      oVar5 = ParseMoney(&log_msg);
      std::__cxx11::string::~string((string *)&log_msg);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_58);
      if (((undefined1  [16])
           oVar5.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long> & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&log_msg,"minrelaytxfee",local_b8);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_78,"-minrelaytxfee",(allocator<char> *)&local_158);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_98,"",(allocator<char> *)local_240);
        ArgsManager::GetArg(&local_58,argsman,&local_78,&local_98);
        common::AmountErrMsg(&local_138,&log_msg,&local_58);
        std::__detail::__variant::_Variant_storage<false,bilingual_str,std::monostate>::
        _Variant_storage<0ul,bilingual_str>
                  ((_Variant_storage<false,bilingual_str,std::monostate> *)__return_storage_ptr__,
                   &local_138);
        this = &local_138;
        goto LAB_007a9fcb;
      }
      (mempool_opts->min_relay_feerate).nSatoshisPerK =
           oVar5.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>._M_payload;
    }
    else {
      lVar1 = (mempool_opts->incremental_relay_feerate).nSatoshisPerK;
      if ((mempool_opts->min_relay_feerate).nSatoshisPerK < lVar1) {
        (mempool_opts->min_relay_feerate).nSatoshisPerK = lVar1;
        local_240[0] = BTC_KVB;
        CFeeRate::ToString_abi_cxx11_(&local_158,&mempool_opts->min_relay_feerate,local_240);
        pLVar4 = LogInstance();
        bVar2 = BCLog::Logger::Enabled(pLVar4);
        if (bVar2) {
          log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
          log_msg._M_string_length = 0;
          log_msg.field_2._M_local_buf[0] = '\0';
          tinyformat::format<std::__cxx11::string>
                    (&local_58,
                     (tinyformat *)"Increasing minrelaytxfee to %s to match incrementalrelayfee\n",
                     (char *)&local_158,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)strDefault
                    );
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (&log_msg,&local_58);
          std::__cxx11::string::~string((string *)&local_58);
          pLVar4 = LogInstance();
          local_58._M_dataplus._M_p = (pointer)0x5e;
          local_58._M_string_length = 0xccb069;
          in_stack_fffffffffffffd98 = 0x5e;
          in_stack_fffffffffffffda0 =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/mempool_args.cpp"
          ;
          in_stack_fffffffffffffdb0 = 2;
          in_stack_fffffffffffffda8 = 0xffffffffffffffff;
          strDefault = (MemPoolOptions *)0x13;
          source_file._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/mempool_args.cpp"
          ;
          source_file._M_len = 0x5e;
          str._M_str = log_msg._M_dataplus._M_p;
          str._M_len = log_msg._M_string_length;
          logging_function._M_str = "ApplyArgsManOptions";
          logging_function._M_len = 0x13;
          BCLog::Logger::LogPrintStr(pLVar4,str,logging_function,source_file,0x45,ALL,Info);
          std::__cxx11::string::~string((string *)&log_msg);
        }
        std::__cxx11::string::~string((string *)&local_158);
      }
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&log_msg,"-dustrelayfee",(allocator<char> *)&local_58);
    bVar2 = ArgsManager::IsArgSet(argsman,&log_msg);
    std::__cxx11::string::~string((string *)&log_msg);
    if (bVar2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_58,"-dustrelayfee",(allocator<char> *)&local_98);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"",local_b8);
      strDefault = (MemPoolOptions *)&local_78;
      ArgsManager::GetArg(&log_msg,argsman,&local_58,(string *)strDefault);
      oVar5 = ParseMoney(&log_msg);
      std::__cxx11::string::~string((string *)&log_msg);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_58);
      if (((undefined1  [16])
           oVar5.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long> & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&log_msg,"dustrelayfee",local_b8);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_78,"-dustrelayfee",(allocator<char> *)&local_158);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_98,"",(allocator<char> *)local_240);
        ArgsManager::GetArg(&local_58,argsman,&local_78,&local_98);
        common::AmountErrMsg(&local_198,&log_msg,&local_58);
        std::__detail::__variant::_Variant_storage<false,bilingual_str,std::monostate>::
        _Variant_storage<0ul,bilingual_str>
                  ((_Variant_storage<false,bilingual_str,std::monostate> *)__return_storage_ptr__,
                   &local_198);
        this = &local_198;
        goto LAB_007a9fcb;
      }
      (mempool_opts->dust_relay_feerate).nSatoshisPerK =
           oVar5.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>._M_payload;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&log_msg,"-permitbaremultisig",(allocator<char> *)&local_58);
    bVar2 = ArgsManager::GetBoolArg(argsman,&log_msg,true);
    mempool_opts->permit_bare_multisig = bVar2;
    std::__cxx11::string::~string((string *)&log_msg);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&log_msg,"-datacarrier",(allocator<char> *)&local_58);
    bVar2 = ArgsManager::GetBoolArg(argsman,&log_msg,true);
    std::__cxx11::string::~string((string *)&log_msg);
    if (bVar2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&log_msg,"-datacarriersize",(allocator<char> *)&local_58);
      iVar3 = ArgsManager::GetIntArg(argsman,&log_msg,0x53);
      if ((mempool_opts->max_datacarrier_bytes).super__Optional_base<unsigned_int,_true,_true>.
          _M_payload.super__Optional_payload_base<unsigned_int>._M_engaged == false) {
        (mempool_opts->max_datacarrier_bytes).super__Optional_base<unsigned_int,_true,_true>.
        _M_payload.super__Optional_payload_base<unsigned_int>._M_engaged = true;
      }
      (mempool_opts->max_datacarrier_bytes).super__Optional_base<unsigned_int,_true,_true>.
      _M_payload.super__Optional_payload_base<unsigned_int>._M_payload._M_value = (uint)iVar3;
      std::__cxx11::string::~string((string *)&log_msg);
    }
    else if ((mempool_opts->max_datacarrier_bytes).super__Optional_base<unsigned_int,_true,_true>.
             _M_payload.super__Optional_payload_base<unsigned_int>._M_engaged == true) {
      (mempool_opts->max_datacarrier_bytes).super__Optional_base<unsigned_int,_true,_true>.
      _M_payload.super__Optional_payload_base<unsigned_int>._M_engaged = false;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&log_msg,"-acceptnonstdtxn",(allocator<char> *)&local_58);
    bVar2 = ArgsManager::GetBoolArg(argsman,&log_msg,false);
    mempool_opts->require_standard = !bVar2;
    std::__cxx11::string::~string((string *)&log_msg);
    if ((chainparams->m_chain_type != MAIN) || (mempool_opts->require_standard != false)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&log_msg,"-mempoolfullrbf",(allocator<char> *)&local_58);
      bVar2 = ArgsManager::GetBoolArg(argsman,&log_msg,mempool_opts->full_rbf);
      mempool_opts->full_rbf = bVar2;
      std::__cxx11::string::~string((string *)&log_msg);
      if (mempool_opts->full_rbf == false) {
        pLVar4 = LogInstance();
        bVar2 = BCLog::Logger::Enabled(pLVar4);
        if (bVar2) {
          log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
          log_msg._M_string_length = 0;
          log_msg.field_2._M_local_buf[0] = '\0';
          tinyformat::format<>
                    (&local_58,
                     "Warning: mempoolfullrbf=0 set but deprecated and will be removed in a future release\n"
                    );
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (&log_msg,&local_58);
          std::__cxx11::string::~string((string *)&local_58);
          pLVar4 = LogInstance();
          local_58._M_dataplus._M_p = (pointer)0x5e;
          local_58._M_string_length = 0xccb069;
          source_file_00._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/mempool_args.cpp"
          ;
          source_file_00._M_len = 0x5e;
          str_00._M_str = log_msg._M_dataplus._M_p;
          str_00._M_len = log_msg._M_string_length;
          logging_function_00._M_str = "ApplyArgsManOptions";
          logging_function_00._M_len = 0x13;
          BCLog::Logger::LogPrintStr(pLVar4,str_00,logging_function_00,source_file_00,0x61,ALL,Info)
          ;
          std::__cxx11::string::~string((string *)&log_msg);
        }
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&log_msg,"-persistmempoolv1",(allocator<char> *)&local_58);
      bVar2 = ArgsManager::GetBoolArg(argsman,&log_msg,mempool_opts->persist_v1_dat);
      mempool_opts->persist_v1_dat = bVar2;
      std::__cxx11::string::~string((string *)&log_msg);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&log_msg,"-limitancestorcount",(allocator<char> *)&local_58);
      iVar3 = ArgsManager::GetIntArg(argsman,&log_msg,(mempool_opts->limits).ancestor_count);
      (mempool_opts->limits).ancestor_count = iVar3;
      std::__cxx11::string::~string((string *)&log_msg);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&log_msg,"-limitancestorsize",(allocator<char> *)&local_58);
      oVar5 = ArgsManager::GetIntArg(argsman,&log_msg);
      std::__cxx11::string::~string((string *)&log_msg);
      if (((undefined1  [16])
           oVar5.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long> & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        (mempool_opts->limits).ancestor_size_vbytes =
             oVar5.super__Optional_base<long,_true,_true>._M_payload.
             super__Optional_payload_base<long>._M_payload * 1000;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&log_msg,"-limitdescendantcount",(allocator<char> *)&local_58);
      iVar3 = ArgsManager::GetIntArg(argsman,&log_msg,(mempool_opts->limits).descendant_count);
      (mempool_opts->limits).descendant_count = iVar3;
      std::__cxx11::string::~string((string *)&log_msg);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&log_msg,"-limitdescendantsize",(allocator<char> *)&local_58);
      oVar5 = ArgsManager::GetIntArg(argsman,&log_msg);
      std::__cxx11::string::~string((string *)&log_msg);
      if (((undefined1  [16])
           oVar5.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long> & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        (mempool_opts->limits).descendant_size_vbytes =
             oVar5.super__Optional_base<long,_true,_true>._M_payload.
             super__Optional_payload_base<long>._M_payload * 1000;
      }
      *(__index_type *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_std::monostate>.
               super__Move_assign_alias<bilingual_str,_std::monostate>.
               super__Copy_assign_alias<bilingual_str,_std::monostate>.
               super__Move_ctor_alias<bilingual_str,_std::monostate>.
               super__Copy_ctor_alias<bilingual_str,_std::monostate>.
               super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x40) = '\x01';
      goto LAB_007aa001;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"acceptnonstdtxn is not currently supported for %s chain",
               (allocator<char> *)&local_78);
    original._M_string_length = (size_type)in_stack_fffffffffffffda0;
    original._M_dataplus._M_p = (pointer)in_stack_fffffffffffffd98;
    original.field_2._M_allocated_capacity = in_stack_fffffffffffffda8;
    original.field_2._8_4_ = in_stack_fffffffffffffdb0;
    original.field_2._12_4_ = in_stack_fffffffffffffdb4;
    Untranslated((bilingual_str *)&log_msg,original);
    CChainParams::GetChainTypeString_abi_cxx11_(&local_58,chainparams);
    tinyformat::format<std::__cxx11::string>
              (&local_1d8,(tinyformat *)&log_msg,(bilingual_str *)&local_58,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)strDefault);
    std::__detail::__variant::_Variant_storage<false,bilingual_str,std::monostate>::
    _Variant_storage<0ul,bilingual_str>
              ((_Variant_storage<false,bilingual_str,std::monostate> *)__return_storage_ptr__,
               &local_1d8);
    bilingual_str::~bilingual_str(&local_1d8);
    std::__cxx11::string::~string((string *)&local_58);
    bilingual_str::~bilingual_str((bilingual_str *)&log_msg);
    this_00 = &local_238;
  }
  std::__cxx11::string::~string((string *)this_00);
LAB_007aa001:
  if (*(pointer *)(in_FS_OFFSET + 0x28) == local_38._M_p) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

util::Result<void> ApplyArgsManOptions(const ArgsManager& argsman, const CChainParams& chainparams, MemPoolOptions& mempool_opts)
{
    mempool_opts.check_ratio = argsman.GetIntArg("-checkmempool", mempool_opts.check_ratio);

    if (auto mb = argsman.GetIntArg("-maxmempool")) mempool_opts.max_size_bytes = *mb * 1'000'000;

    if (auto hours = argsman.GetIntArg("-mempoolexpiry")) mempool_opts.expiry = std::chrono::hours{*hours};

    // incremental relay fee sets the minimum feerate increase necessary for replacement in the mempool
    // and the amount the mempool min fee increases above the feerate of txs evicted due to mempool limiting.
    if (argsman.IsArgSet("-incrementalrelayfee")) {
        if (std::optional<CAmount> inc_relay_fee = ParseMoney(argsman.GetArg("-incrementalrelayfee", ""))) {
            mempool_opts.incremental_relay_feerate = CFeeRate{inc_relay_fee.value()};
        } else {
            return util::Error{AmountErrMsg("incrementalrelayfee", argsman.GetArg("-incrementalrelayfee", ""))};
        }
    }

    if (argsman.IsArgSet("-minrelaytxfee")) {
        if (std::optional<CAmount> min_relay_feerate = ParseMoney(argsman.GetArg("-minrelaytxfee", ""))) {
            // High fee check is done afterward in CWallet::Create()
            mempool_opts.min_relay_feerate = CFeeRate{min_relay_feerate.value()};
        } else {
            return util::Error{AmountErrMsg("minrelaytxfee", argsman.GetArg("-minrelaytxfee", ""))};
        }
    } else if (mempool_opts.incremental_relay_feerate > mempool_opts.min_relay_feerate) {
        // Allow only setting incremental fee to control both
        mempool_opts.min_relay_feerate = mempool_opts.incremental_relay_feerate;
        LogPrintf("Increasing minrelaytxfee to %s to match incrementalrelayfee\n", mempool_opts.min_relay_feerate.ToString());
    }

    // Feerate used to define dust.  Shouldn't be changed lightly as old
    // implementations may inadvertently create non-standard transactions
    if (argsman.IsArgSet("-dustrelayfee")) {
        if (std::optional<CAmount> parsed = ParseMoney(argsman.GetArg("-dustrelayfee", ""))) {
            mempool_opts.dust_relay_feerate = CFeeRate{parsed.value()};
        } else {
            return util::Error{AmountErrMsg("dustrelayfee", argsman.GetArg("-dustrelayfee", ""))};
        }
    }

    mempool_opts.permit_bare_multisig = argsman.GetBoolArg("-permitbaremultisig", DEFAULT_PERMIT_BAREMULTISIG);

    if (argsman.GetBoolArg("-datacarrier", DEFAULT_ACCEPT_DATACARRIER)) {
        mempool_opts.max_datacarrier_bytes = argsman.GetIntArg("-datacarriersize", MAX_OP_RETURN_RELAY);
    } else {
        mempool_opts.max_datacarrier_bytes = std::nullopt;
    }

    mempool_opts.require_standard = !argsman.GetBoolArg("-acceptnonstdtxn", DEFAULT_ACCEPT_NON_STD_TXN);
    if (!chainparams.IsTestChain() && !mempool_opts.require_standard) {
        return util::Error{strprintf(Untranslated("acceptnonstdtxn is not currently supported for %s chain"), chainparams.GetChainTypeString())};
    }

    mempool_opts.full_rbf = argsman.GetBoolArg("-mempoolfullrbf", mempool_opts.full_rbf);
    if (!mempool_opts.full_rbf) {
        LogInfo("Warning: mempoolfullrbf=0 set but deprecated and will be removed in a future release\n");
    }

    mempool_opts.persist_v1_dat = argsman.GetBoolArg("-persistmempoolv1", mempool_opts.persist_v1_dat);

    ApplyArgsManOptions(argsman, mempool_opts.limits);

    return {};
}